

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O0

void ZXing::Pdf417::EncodeNumeric
               (wstring *msg,int startpos,int count,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  int *piVar2;
  iterator this;
  vector<int,_std::allocator<int>_> *in_RCX;
  wchar_t in_EDX;
  ulong in_RDI;
  BigInteger r;
  BigInteger bigint;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> part;
  int len;
  BigInteger num900;
  vector<int,_std::allocator<int>_> tmp;
  int idx;
  BigInteger *in_stack_fffffffffffffe88;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffe90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  enable_if_t<std::is_integral_v<int>_&&_std::is_signed_v<int>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  BigInteger *in_stack_fffffffffffffec0;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffee0;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffee8;
  const_iterator in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  BigInteger *in_stack_ffffffffffffff08;
  BigInteger *in_stack_ffffffffffffff10;
  wstring local_b8 [32];
  wstring local_98 [36];
  int local_74 [15];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  vector<int,_std::allocator<int>_> *local_18;
  wchar_t local_10;
  ulong local_8;
  
  local_38.field_2._M_local_buf[3] = L'\0';
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2dd5b2);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  BigInteger::BigInteger<int>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0);
  while (local_38.field_2._M_local_buf[3] < local_10) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2dd620);
    local_74[1] = 0x2c;
    local_74[0] = local_10 - local_38.field_2._12_4_;
    piVar2 = std::min<int>(local_74 + 1,local_74);
    local_74[2] = *piVar2;
    std::__cxx11::wstring::substr((ulong)local_b8,local_8);
    std::operator+((wchar_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::__cxx11::wstring::~wstring(local_b8);
    BigInteger::BigInteger((BigInteger *)0x2dd6db);
    BigInteger::BigInteger((BigInteger *)0x2dd6e8);
    BigInteger::TryParse(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    do {
      BigInteger::Divide(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         (BigInteger *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                         ,(BigInteger *)in_stack_fffffffffffffef8._M_current);
      in_stack_ffffffffffffff04 = BigInteger::toInt(in_stack_fffffffffffffe88);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                 (value_type_conflict3 *)in_stack_fffffffffffffe88);
      bVar1 = BigInteger::isZero((BigInteger *)0x2dd75e);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    in_stack_fffffffffffffe98 = local_18;
    this = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffe90,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 = (vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffee8;
    in_stack_fffffffffffffe90 = &local_38;
    std::vector<int,_std::allocator<int>_>::rbegin(in_stack_fffffffffffffe98);
    std::vector<int,_std::allocator<int>_>::rend(in_stack_fffffffffffffe98);
    std::vector<int,std::allocator<int>>::
    insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,void>
              ((vector<int,_std::allocator<int>_> *)this._M_current,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_38.field_2._M_local_buf[3] = local_74[2] + local_38.field_2._M_local_buf[3];
    BigInteger::~BigInteger((BigInteger *)0x2dd810);
    BigInteger::~BigInteger((BigInteger *)0x2dd81d);
    std::__cxx11::wstring::~wstring(local_98);
  }
  BigInteger::~BigInteger((BigInteger *)0x2dd8ce);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void EncodeNumeric(const std::wstring& msg, int startpos, int count, std::vector<int>& output)
{
	int idx = 0;
	std::vector<int> tmp;
	tmp.reserve(count / 3 + 1);
	BigInteger num900(900);
	while (idx < count) {
		tmp.clear();
		int len = std::min(44, count - idx);
		auto part = L"1" + msg.substr(startpos + idx, len);

		BigInteger bigint, r;
		BigInteger::TryParse(part, bigint);
		do {
			BigInteger::Divide(bigint, num900, bigint, r);
			tmp.push_back(r.toInt());
		} while (!bigint.isZero());

		//Reverse temporary string
		output.insert(output.end(), tmp.rbegin(), tmp.rend());
		idx += len;
	}
}